

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

int __thiscall
anon_unknown.dwarf_667a22::TransformSelectorIndexes::NormalizeIndex
          (TransformSelectorIndexes *this,int index,size_t count)

{
  transform_error *this_00;
  unsigned_long local_b8;
  cmAlphaNum local_b0;
  cmAlphaNum local_70;
  string local_40;
  size_t local_20;
  size_t count_local;
  TransformSelectorIndexes *pTStack_10;
  int index_local;
  TransformSelectorIndexes *this_local;
  
  count_local._4_4_ = index;
  if (index < 0) {
    count_local._4_4_ = (int)count + index;
  }
  if ((-1 < count_local._4_4_) && ((ulong)(long)count_local._4_4_ < count)) {
    return count_local._4_4_;
  }
  local_20 = count;
  pTStack_10 = this;
  this_00 = (transform_error *)__cxa_allocate_exception(0x10);
  cmAlphaNum::cmAlphaNum(&local_70,"sub-command TRANSFORM, selector ");
  cmAlphaNum::cmAlphaNum(&local_b0,&(this->super_TransformSelector).Tag);
  local_b8 = local_20 - 1;
  cmStrCat<char[10],int,char[17],unsigned_long,char[3],unsigned_long,char[3]>
            (&local_40,&local_70,&local_b0,(char (*) [10])", index: ",
             (int *)((long)&count_local + 4),(char (*) [17])" out of range (-",&local_20,
             (char (*) [3])0xdc3e89,&local_b8,(char (*) [3])0xdae3a0);
  transform_error::transform_error(this_00,&local_40);
  __cxa_throw(this_00,&(anonymous_namespace)::transform_error::typeinfo,
              transform_error::~transform_error);
}

Assistant:

int NormalizeIndex(int index, std::size_t count)
  {
    if (index < 0) {
      index = static_cast<int>(count) + index;
    }
    if (index < 0 || count <= static_cast<std::size_t>(index)) {
      throw transform_error(cmStrCat(
        "sub-command TRANSFORM, selector ", this->Tag, ", index: ", index,
        " out of range (-", count, ", ", count - 1, ")."));
    }
    return index;
  }